

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

QSize __thiscall QHeaderView::sizeHint(QHeaderView *this)

{
  long lVar1;
  bool bVar2;
  int logicalIndex;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int checked;
  int iVar6;
  int checked_1;
  int logicalIndex_00;
  uint uVar7;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if ((*(int *)(lVar1 + 0x5b0) < 0) || (*(int *)(lVar1 + 0x5b4) < 0)) {
    *(undefined8 *)(lVar1 + 0x5b0) = 0;
    logicalIndex = count(this);
    iVar6 = 0;
    for (logicalIndex_00 = 0; (iVar6 < 100 && (logicalIndex_00 < logicalIndex));
        logicalIndex_00 = logicalIndex_00 + 1) {
      bVar2 = isSectionHidden(this,logicalIndex_00);
      if (!bVar2) {
        iVar6 = iVar6 + 1;
        uVar3 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget + 0x308))(this,logicalIndex_00);
        uVar4 = uVar3 >> 0x20;
        uVar5 = (ulong)*(uint *)(lVar1 + 0x5b0);
        if ((int)*(uint *)(lVar1 + 0x5b0) <= (int)uVar3) {
          uVar5 = uVar3 & 0xffffffff;
        }
        if ((int)(uVar3 >> 0x20) < (int)*(uint *)(lVar1 + 0x5b4)) {
          uVar4 = (ulong)*(uint *)(lVar1 + 0x5b4);
        }
        *(ulong *)(lVar1 + 0x5b0) = uVar5 | uVar4 << 0x20;
      }
    }
    iVar6 = logicalIndex + -100;
    if (logicalIndex + -100 < logicalIndex_00) {
      iVar6 = logicalIndex_00;
    }
    uVar7 = 0;
    while ((iVar6 < logicalIndex && (uVar7 < 100))) {
      logicalIndex = logicalIndex + -1;
      bVar2 = isSectionHidden(this,logicalIndex);
      if (!bVar2) {
        uVar7 = uVar7 + 1;
        uVar3 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget + 0x308))(this,logicalIndex);
        uVar4 = uVar3 >> 0x20;
        uVar5 = (ulong)*(uint *)(lVar1 + 0x5b0);
        if ((int)*(uint *)(lVar1 + 0x5b0) <= (int)uVar3) {
          uVar5 = uVar3 & 0xffffffff;
        }
        if ((int)(uVar3 >> 0x20) < (int)*(uint *)(lVar1 + 0x5b4)) {
          uVar4 = (ulong)*(uint *)(lVar1 + 0x5b4);
        }
        *(ulong *)(lVar1 + 0x5b0) = uVar5 | uVar4 << 0x20;
      }
    }
  }
  return *(QSize *)(lVar1 + 0x5b0);
}

Assistant:

QSize QHeaderView::sizeHint() const
{
    Q_D(const QHeaderView);
    if (d->cachedSizeHint.isValid())
        return d->cachedSizeHint;
    d->cachedSizeHint = QSize(0, 0); //reinitialize the cached size hint
    const int sectionCount = count();

    // get size hint for the first n sections
    int i = 0;
    for (int checked = 0; checked < 100 && i < sectionCount; ++i) {
        if (isSectionHidden(i))
            continue;
        checked++;
        QSize hint = sectionSizeFromContents(i);
        d->cachedSizeHint = d->cachedSizeHint.expandedTo(hint);
    }
    // get size hint for the last n sections
    i = qMax(i, sectionCount - 100 );
    for (int j = sectionCount - 1, checked = 0; j >= i && checked < 100; --j) {
        if (isSectionHidden(j))
            continue;
        checked++;
        QSize hint = sectionSizeFromContents(j);
        d->cachedSizeHint = d->cachedSizeHint.expandedTo(hint);
    }
    return d->cachedSizeHint;
}